

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.c
# Opt level: O2

SeatDialogPromptDescriptions * console_prompt_descriptions(Seat *seat)

{
  return &console_prompt_descriptions::descs;
}

Assistant:

const SeatDialogPromptDescriptions *console_prompt_descriptions(Seat *seat)
{
    static const SeatDialogPromptDescriptions descs = {
        .hk_accept_action = "enter \"y\"",
        .hk_connect_once_action = "enter \"n\"",
        .hk_cancel_action = "press Return",
        .hk_cancel_action_Participle = "Pressing Return",
    };
    return &descs;
}